

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# optional.hpp
# Opt level: O2

void __thiscall
nonstd::optional_lite::
optional<tinyusdz::Animatable<std::vector<std::array<double,2ul>,std::allocator<std::array<double,2ul>>>>>
::
initialize<tinyusdz::Animatable<std::vector<std::array<double,2ul>,std::allocator<std::array<double,2ul>>>>>
          (optional<tinyusdz::Animatable<std::vector<std::array<double,2ul>,std::allocator<std::array<double,2ul>>>>>
           *this,Animatable<std::vector<std::array<double,_2UL>,_std::allocator<std::array<double,_2UL>_>_>_>
                 *value)

{
  if (*this != (optional<tinyusdz::Animatable<std::vector<std::array<double,2ul>,std::allocator<std::array<double,2ul>>>>>
                )0x1) {
    tinyusdz::
    Animatable<std::vector<std::array<double,_2UL>,_std::allocator<std::array<double,_2UL>_>_>_>::
    Animatable((Animatable<std::vector<std::array<double,_2UL>,_std::allocator<std::array<double,_2UL>_>_>_>
                *)(this + 8),value);
    *this = (optional<tinyusdz::Animatable<std::vector<std::array<double,2ul>,std::allocator<std::array<double,2ul>>>>>
             )0x1;
    return;
  }
  __assert_fail("! has_value()",
                "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/nonstd/optional.hpp"
                ,0x5dd,
                "void nonstd::optional_lite::optional<tinyusdz::Animatable<std::vector<std::array<double, 2>>>>::initialize(V &&) [T = tinyusdz::Animatable<std::vector<std::array<double, 2>>>, V = tinyusdz::Animatable<std::vector<std::array<double, 2>>>]"
               );
}

Assistant:

void initialize( V && value )
    {
        assert( ! has_value()  );
        contained.construct_value( std::move( value ) );
        has_value_ = true;
    }